

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_flush_one_mmuidx_locked(CPUArchState_conflict30 *env,int mmu_idx,int64_t now)

{
  ulong uVar1;
  FILE *__stream;
  long lVar2;
  ulong uVar3;
  gpointer pvVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  CPUTLBDescFast *fast;
  gsize __n;
  ulong uVar11;
  
  lVar7 = (long)mmu_idx;
  lVar2 = lVar7 * 0x2b0;
  uVar9 = (*(ulong *)(env->gpr_a + lVar7 * 4 + -0x10) >> 6) + 1;
  uVar11 = *(ulong *)((long)env + lVar2 + -0x840);
  uVar1 = *(ulong *)((long)env + lVar2 + -0x838);
  if (uVar11 < uVar1) {
    *(ulong *)((long)env + lVar2 + -0x840) = uVar1;
    uVar11 = uVar1;
  }
  fast = (CPUTLBDescFast *)(env->gpr_a + lVar7 * 4 + -0x10);
  lVar10 = *(long *)((long)env + lVar2 + -0x848) + 100000000;
  uVar3 = (uVar11 * 100) / uVar9;
  if (uVar3 < 0x47) {
    if ((uVar3 < 0x1e) && (lVar10 < now)) {
      uVar8 = uVar11 - 1;
      uVar3 = 0x40;
      if (uVar8 != 0) {
        uVar3 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar3 = uVar3 ^ 0x3f;
      }
      uVar8 = (ulong)(uVar11 == 0);
      if (uVar3 != 0) {
        uVar8 = 0x8000000000000000 >> ((char)uVar3 - 1U & 0x3f);
      }
      uVar8 = uVar8 << (0x46 < (uVar11 * 100) / uVar8);
      uVar11 = 0x40;
      if (0x40 < uVar8) {
        uVar11 = uVar8;
      }
      goto LAB_00b335e4;
    }
  }
  else {
    uVar11 = 0x40000;
    if (uVar9 * 2 < 0x40000) {
      uVar11 = uVar9 * 2;
    }
LAB_00b335e4:
    if (uVar11 != uVar9) {
      g_free(*(gpointer *)(env->gpr_a + lVar7 * 4 + -0xe));
      g_free(*(gpointer *)((long)env + lVar2 + -0x5a8));
      *(int64_t *)((long)env + lVar2 + -0x848) = now;
      *(undefined8 *)((long)env + lVar2 + -0x840) = 0;
      fast->mask = uVar11 * 0x40 - 0x40;
      pvVar4 = g_try_malloc_n(uVar11,0x40);
      *(gpointer *)(env->gpr_a + lVar7 * 4 + -0xe) = pvVar4;
      pvVar4 = g_try_malloc_n(uVar11,0x10);
      *(gpointer *)((long)env + lVar2 + -0x5a8) = pvVar4;
      if (pvVar4 != (gpointer)0x0) {
        memset(pvVar4,0,uVar11 << 4);
      }
      while ((__stream = _stderr, pvVar4 = *(gpointer *)(env->gpr_a + lVar7 * 4 + -0xe),
             pvVar4 == (gpointer)0x0 || (*(long *)((long)env + lVar2 + -0x5a8) == 0))) {
        if (uVar11 == 0x40) {
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          fprintf(__stream,"%s: %s.\n","tlb_mmu_resize_locked",pcVar6);
          abort();
        }
        uVar11 = uVar11 >> 1;
        if (uVar11 < 0x41) {
          uVar11 = 0x40;
        }
        fast->mask = uVar11 * 0x40 - 0x40;
        g_free(pvVar4);
        g_free(*(gpointer *)((long)env + lVar2 + -0x5a8));
        pvVar4 = g_try_malloc_n(uVar11,0x40);
        *(gpointer *)(env->gpr_a + lVar7 * 4 + -0xe) = pvVar4;
        pvVar4 = g_try_malloc_n(uVar11,0x10);
        *(gpointer *)((long)env + lVar2 + -0x5a8) = pvVar4;
      }
      goto LAB_00b335f6;
    }
  }
  if (lVar10 < now) {
    *(int64_t *)((long)env + lVar2 + -0x848) = now;
    *(ulong *)((long)env + lVar2 + -0x840) = uVar1;
  }
LAB_00b335f6:
  tlb_mmu_flush_locked((CPUTLBDesc_conflict *)((long)env + lVar2 + -0x850),fast);
  return;
}

Assistant:

static void tlb_flush_one_mmuidx_locked(CPUArchState *env, int mmu_idx,
                                        int64_t now)
{
    CPUTLBDesc *desc = &env_tlb(env)->d[mmu_idx];
    CPUTLBDescFast *fast = &env_tlb(env)->f[mmu_idx];

    tlb_mmu_resize_locked(env->uc, desc, fast, now);
    tlb_mmu_flush_locked(desc, fast);
}